

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_buffer_decode(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  IRType t_00;
  TRef tr;
  TRef tmp;
  IRType t;
  SBufExt sbx;
  GCstr *str;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  if ((int)(rd->argv->field_4).it >> 0xf == -5) {
    sbx._64_8_ = rd->argv->u64 & 0x7fffffffffff;
    TVar1 = recff_tmpref(J,0x7fff,2);
    TVar2 = lj_ir_call(J,IRCALL_lj_serialize_decode,(ulong)TVar1,(ulong)*J->base);
    (J->fold).ins.field_0.ot = 0x1200;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = 0;
    lj_opt_fold(J);
    memset(&tmp,0,0x48);
    sbx.e = (char *)(sbx._64_8_ + 0x18);
    sbx.b = (char *)((long)&(J->L->nextgc).gcptr64 + 3);
    _tmp = (char *)((long)sbx.e + (ulong)*(uint *)(sbx._64_8_ + 0x14));
    sbx.w = _tmp;
    sbx.field_4 = (anon_union_8_2_d9f1b0d6_for_SBufExt_4)sbx.e;
    t_00 = lj_serialize_peektype((SBufExt *)&tmp);
    TVar1 = lj_record_vload(J,TVar1,0,t_00);
    *J->base = TVar1;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_decode(jit_State *J, RecordFFData *rd)
{
  if (tvisstr(&rd->argv[0])) {
    GCstr *str = strV(&rd->argv[0]);
    SBufExt sbx;
    IRType t;
    TRef tmp = recff_tmpref(J, TREF_NIL, IRTMPREF_OUT1);
    TRef tr = lj_ir_call(J, IRCALL_lj_serialize_decode, tmp, J->base[0]);
    /* IR_USE needed for IR_CALLA, because the decoder may throw non-OOM.
    ** That's why IRCALL_lj_serialize_decode needs a fake INT result.
    */
    emitir(IRT(IR_USE, IRT_NIL), tr, 0);
    memset(&sbx, 0, sizeof(SBufExt));
    lj_bufx_set_cow(J->L, &sbx, strdata(str), str->len);
    t = (IRType)lj_serialize_peektype(&sbx);
    J->base[0] = lj_record_vload(J, tmp, 0, t);
  }  /* else: Interpreter will throw. */
}